

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

void __thiscall icu_63::RegexCompile::matchStartType(RegexCompile *this)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint delta;
  uint uVar4;
  UChar32 UVar5;
  ulong uVar6;
  UnicodeSet *pUVar7;
  int64_t iVar8;
  UChar32 c_3;
  int32_t jmpDest_2;
  int32_t depth;
  int32_t minLoopCount;
  int32_t loopEndLoc;
  UnicodeSet s_7;
  UChar32 c_2;
  int32_t stringStartIdx_1;
  int32_t stringLen_1;
  int32_t stringLenOp_1;
  UChar32 c_1;
  int32_t stringStartIdx;
  int32_t stringLen;
  int32_t stringLenOp;
  int32_t jmpDest_1;
  int32_t jmpDest;
  UnicodeSet starters;
  undefined1 local_1f8 [4];
  UChar32 c;
  UnicodeSet s_6;
  UnicodeSet s_5;
  UnicodeSet s_4;
  UnicodeSet sc;
  UnicodeSet *s_3;
  int32_t sn_3;
  UnicodeSet *s_2;
  int32_t sn_2;
  UnicodeSet *s_1;
  int32_t sn_1;
  UnicodeSet *s;
  int32_t sn;
  undefined1 local_50 [8];
  UVector32 forwardedLength;
  int32_t end;
  int32_t iStack_20;
  UBool atStart;
  int32_t numInitialStrings;
  int32_t currentLen;
  int32_t opType;
  int32_t op;
  int32_t loc;
  RegexCompile *this_local;
  
  UVar2 = ::U_FAILURE(*this->fStatus);
  if (UVar2 == '\0') {
    iStack_20 = 0;
    end = 0;
    bVar1 = true;
    forwardedLength.elements._4_4_ = UVector64::size(this->fRXPat->fCompiledPat);
    UVector32::UVector32((UVector32 *)local_50,forwardedLength.elements._4_4_ + 1,this->fStatus);
    UVector32::setSize((UVector32 *)local_50,forwardedLength.elements._4_4_ + 1);
    for (opType = 3; opType < forwardedLength.elements._4_4_; opType = opType + 1) {
      UVector32::setElementAt((UVector32 *)local_50,0x7fffffff,opType);
    }
    for (opType = 3; opType < forwardedLength.elements._4_4_; opType = opType + 1) {
      uVar6 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType);
      uVar4 = (uint)uVar6;
      currentLen._3_1_ = (char)(uVar6 >> 0x18);
      iVar3 = UVector32::elementAti((UVector32 *)local_50,opType);
      if (iVar3 < iStack_20) {
        iStack_20 = UVector32::elementAti((UVector32 *)local_50,opType);
      }
      switch(currentLen._3_1_) {
      case '\0':
      case '\x02':
      case '\x05':
      case '\a':
      case '\b':
      case '\t':
      case '\x0e':
      case '\x10':
      case '\x11':
      case '\x14':
      case '\x18':
      case '\x1f':
      case ' ':
      case '!':
      case '\"':
      case '#':
      case ')':
      case '*':
      case '5':
      case '6':
      case '7':
        break;
      case '\x01':
        iStack_20 = UVector32::elementAti((UVector32 *)local_50,opType + 1);
        bVar1 = false;
        break;
      case '\x03':
        if (iStack_20 == 0) {
          UnicodeSet::add(this->fRXPat->fInitialChars,uVar4 & 0xffffff);
          end = end + 2;
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '\x04':
        opType = opType + 1;
        iVar8 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType);
        delta = (uint)iVar8 & 0xffffff;
        if (iStack_20 == 0) {
          UVar5 = icu_63::UnicodeString::char32At(&this->fRXPat->fLiteralText,uVar4 & 0xffffff);
          UnicodeSet::add(this->fRXPat->fInitialChars,UVar5);
          end = end + 1;
          this->fRXPat->fInitialStringIdx = uVar4 & 0xffffff;
          this->fRXPat->fInitialStringLen = delta;
        }
        iStack_20 = safeIncrement(iStack_20,delta);
        bVar1 = false;
        break;
      case '\x06':
        uVar4 = uVar4 & 0xffffff;
        if ((opType < (int)uVar4) &&
           (iVar3 = UVector32::elementAti((UVector32 *)local_50,uVar4), iStack_20 < iVar3)) {
          UVector32::setElementAt((UVector32 *)local_50,iStack_20,uVar4);
        }
        bVar1 = false;
        break;
      case '\n':
        if (iStack_20 == 0) {
          UnicodeSet::addAll(this->fRXPat->fInitialChars,
                             this->fRXPat->fStaticSets[(int)(uVar4 & 0xffffff)]);
          end = end + 2;
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '\v':
        if (iStack_20 == 0) {
          pUVar7 = (UnicodeSet *)UVector::elementAt(this->fRXPat->fSets,uVar4 & 0xffffff);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,pUVar7);
          end = end + 2;
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '\f':
      case '\x13':
      case '\x15':
      case '\x1b':
        if (iStack_20 == 0) {
          UnicodeSet::clear(this->fRXPat->fInitialChars);
          UnicodeSet::complement(this->fRXPat->fInitialChars);
          end = end + 2;
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '\x0f':
      case '\x12':
        bVar1 = false;
        break;
      case '\x16':
        if (iStack_20 == 0) {
          UnicodeSet::UnicodeSet((UnicodeSet *)&s_5.fFlags);
          UnicodeSet::applyIntPropertyValue
                    ((UnicodeSet *)&s_5.fFlags,UCHAR_GENERAL_CATEGORY_MASK,0x200,this->fStatus);
          if ((uVar6 & 0xffffff) != 0) {
            UnicodeSet::complement((UnicodeSet *)&s_5.fFlags);
          }
          UnicodeSet::addAll(this->fRXPat->fInitialChars,(UnicodeSet *)&s_5.fFlags);
          end = end + 2;
          UnicodeSet::~UnicodeSet((UnicodeSet *)&s_5.fFlags);
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '\x17':
        if (bVar1) {
          this->fRXPat->fStartType = 3;
        }
        break;
      case '\x19':
      case '\x1a':
        iVar8 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType + 1);
        depth = (uint)iVar8 & 0xffffff;
        iVar8 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType + 2);
        if (((int)iVar8 == 0) &&
           (iVar3 = UVector32::elementAti((UVector32 *)local_50,depth), iStack_20 < iVar3)) {
          UVector32::setElementAt((UVector32 *)local_50,iStack_20,depth);
        }
        opType = opType + 3;
        bVar1 = false;
        break;
      case '\x1c':
      case '\x1d':
        bVar1 = false;
        break;
      case '\x1e':
      case '+':
        if (bVar1) {
          this->fRXPat->fStartType = 4;
        }
        break;
      case '$':
        opType = opType + 1;
      case '\r':
        uVar4 = uVar4 & 0xffffff;
        if ((int)uVar4 < opType) {
          iStack_20 = UVector32::elementAti((UVector32 *)local_50,opType + 1);
        }
        else {
          iVar3 = UVector32::elementAti((UVector32 *)local_50,uVar4);
          if (iStack_20 < iVar3) {
            UVector32::setElementAt((UVector32 *)local_50,iStack_20,uVar4);
          }
        }
        bVar1 = false;
        break;
      case '%':
      case ',':
        c_3 = 1;
        if (currentLen._3_1_ == '%') {
          c_3 = 2;
        }
        while( true ) {
          opType = opType + 1;
          iVar8 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType);
          uVar4 = (uint)iVar8;
          if (uVar4 >> 0x18 == 0x25) {
            c_3 = c_3 + 2;
          }
          if (uVar4 >> 0x18 == 0x2c) {
            c_3 = c_3 + 1;
          }
          if (((uVar4 >> 0x18 == 0x26) || (uVar4 >> 0x18 == 0x30)) && (c_3 = c_3 + -1, c_3 == 0))
          break;
          if (((uVar4 >> 0x18 == 6) && (uVar4 = uVar4 & 0xffffff, opType < (int)uVar4)) &&
             (iVar3 = UVector32::elementAti((UVector32 *)local_50,uVar4), iStack_20 < iVar3)) {
            UVector32::setElementAt((UVector32 *)local_50,iStack_20,uVar4);
          }
        }
        break;
      case '&':
      case '-':
      case '.':
      case '/':
      case '0':
        break;
      case '\'':
        if (iStack_20 == 0) {
          starters._84_4_ = uVar4 & 0xffffff;
          UVar2 = u_hasBinaryProperty_63(starters._84_4_,UCHAR_CASE_SENSITIVE);
          if (UVar2 == '\0') {
            UnicodeSet::add(this->fRXPat->fInitialChars,starters._84_4_);
          }
          else {
            UnicodeSet::UnicodeSet((UnicodeSet *)&jmpDest_1,starters._84_4_,starters._84_4_);
            UnicodeSet::closeOver((UnicodeSet *)&jmpDest_1,2);
            UnicodeSet::addAll(this->fRXPat->fInitialChars,(UnicodeSet *)&jmpDest_1);
            UnicodeSet::~UnicodeSet((UnicodeSet *)&jmpDest_1);
          }
          end = end + 2;
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '(':
        opType = opType + 1;
        iVar8 = UVector64::elementAti(this->fRXPat->fCompiledPat,opType);
        if (iStack_20 == 0) {
          s_7._84_4_ = uVar4 & 0xffffff;
          s_7._80_4_ = icu_63::UnicodeString::char32At(&this->fRXPat->fLiteralText,s_7._84_4_);
          UnicodeSet::UnicodeSet((UnicodeSet *)&minLoopCount);
          findCaseInsensitiveStarters(s_7._80_4_,(UnicodeSet *)&minLoopCount);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,(UnicodeSet *)&minLoopCount);
          end = end + 2;
          UnicodeSet::~UnicodeSet((UnicodeSet *)&minLoopCount);
        }
        iStack_20 = safeIncrement(iStack_20,(uint)iVar8 & 0xffffff);
        bVar1 = false;
        break;
      case '1':
        if (iStack_20 == 0) {
          UnicodeSet::UnicodeSet
                    ((UnicodeSet *)&s_4.fFlags,this->fRXPat->fStaticSets[(int)(uVar4 & 0xffffff)]);
          UnicodeSet::complement((UnicodeSet *)&s_4.fFlags);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,(UnicodeSet *)&s_4.fFlags);
          end = end + 2;
          UnicodeSet::~UnicodeSet((UnicodeSet *)&s_4.fFlags);
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '2':
        if (iStack_20 == 0) {
          pUVar7 = (UnicodeSet *)UVector::elementAt(this->fRXPat->fSets,uVar4 & 0xffffff);
          UnicodeSet::addAll(this->fRXPat->fInitialChars,pUVar7);
          end = end + 2;
        }
        bVar1 = false;
        break;
      case '3':
        bVar1 = false;
        break;
      case '4':
        if (iStack_20 == 0) {
          UnicodeSet::clear(this->fRXPat->fInitialChars);
          UnicodeSet::complement(this->fRXPat->fInitialChars);
          end = end + 2;
        }
        bVar1 = false;
        break;
      case '8':
        if (iStack_20 == 0) {
          UnicodeSet::UnicodeSet((UnicodeSet *)&s_6.fFlags);
          UnicodeSet::applyIntPropertyValue
                    ((UnicodeSet *)&s_6.fFlags,UCHAR_GENERAL_CATEGORY_MASK,0x1000,this->fStatus);
          UnicodeSet::add((UnicodeSet *)&s_6.fFlags,9);
          if ((uVar6 & 0xffffff) != 0) {
            UnicodeSet::complement((UnicodeSet *)&s_6.fFlags);
          }
          UnicodeSet::addAll(this->fRXPat->fInitialChars,(UnicodeSet *)&s_6.fFlags);
          end = end + 2;
          UnicodeSet::~UnicodeSet((UnicodeSet *)&s_6.fFlags);
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
        break;
      case '9':
      case ':':
        if (iStack_20 == 0) {
          UnicodeSet::UnicodeSet((UnicodeSet *)local_1f8);
          UnicodeSet::add((UnicodeSet *)local_1f8,10,0xd);
          UnicodeSet::add((UnicodeSet *)local_1f8,0x85);
          UnicodeSet::add((UnicodeSet *)local_1f8,0x2028,0x2029);
          if ((uVar6 & 0xffffff) != 0) {
            UnicodeSet::complement((UnicodeSet *)local_1f8);
          }
          UnicodeSet::addAll(this->fRXPat->fInitialChars,(UnicodeSet *)local_1f8);
          end = end + 2;
          UnicodeSet::~UnicodeSet((UnicodeSet *)local_1f8);
        }
        iStack_20 = safeIncrement(iStack_20,1);
        bVar1 = false;
      }
    }
    iVar3 = UVector32::elementAti((UVector32 *)local_50,forwardedLength.elements._4_4_ + 1);
    if (iVar3 < iStack_20) {
      UVector32::elementAti((UVector32 *)local_50,forwardedLength.elements._4_4_ + 1);
    }
    Regex8BitSet::init(this->fRXPat->fInitialChars8,(EVP_PKEY_CTX *)this->fRXPat->fInitialChars);
    if (this->fRXPat->fStartType != 3) {
      if ((end == 1) && (0 < this->fRXPat->fMinMatchLen)) {
        UVar5 = icu_63::UnicodeString::char32At
                          (&this->fRXPat->fLiteralText,this->fRXPat->fInitialStringIdx);
        this->fRXPat->fStartType = 5;
        this->fRXPat->fInitialChar = UVar5;
      }
      else if (this->fRXPat->fStartType != 4) {
        if (this->fRXPat->fMinMatchLen == 0) {
          this->fRXPat->fStartType = 0;
        }
        else {
          iVar3 = UnicodeSet::size(this->fRXPat->fInitialChars);
          if (iVar3 == 1) {
            this->fRXPat->fStartType = 1;
            UVar5 = UnicodeSet::charAt(this->fRXPat->fInitialChars,0);
            this->fRXPat->fInitialChar = UVar5;
          }
          else {
            UVar2 = UnicodeSet::contains(this->fRXPat->fInitialChars,0,0x10ffff);
            if ((UVar2 == '\0') && (0 < this->fRXPat->fMinMatchLen)) {
              this->fRXPat->fStartType = 2;
            }
            else {
              this->fRXPat->fStartType = 0;
            }
          }
        }
      }
    }
    UVector32::~UVector32((UVector32 *)local_50);
  }
  return;
}

Assistant:

void   RegexCompile::matchStartType() {
    if (U_FAILURE(*fStatus)) {
        return;
    }


    int32_t    loc;                    // Location in the pattern of the current op being processed.
    int32_t    op;                     // The op being processed
    int32_t    opType;                 // The opcode type of the op
    int32_t    currentLen = 0;         // Minimum length of a match to this point (loc) in the pattern
    int32_t    numInitialStrings = 0;  // Number of strings encountered that could match at start.

    UBool      atStart = TRUE;         // True if no part of the pattern yet encountered
                                       //   could have advanced the position in a match.
                                       //   (Maximum match length so far == 0)

    // forwardedLength is a vector holding minimum-match-length values that
    //   are propagated forward in the pattern by JMP or STATE_SAVE operations.
    //   It must be one longer than the pattern being checked because some  ops
    //   will jmp to a end-of-block+1 location from within a block, and we must
    //   count those when checking the block.
    int32_t end = fRXPat->fCompiledPat->size();
    UVector32  forwardedLength(end+1, *fStatus);
    forwardedLength.setSize(end+1);
    for (loc=3; loc<end; loc++) {
        forwardedLength.setElementAt(INT32_MAX, loc);
    }

    for (loc = 3; loc<end; loc++) {
        op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
        opType = URX_TYPE(op);

        // The loop is advancing linearly through the pattern.
        // If the op we are now at was the destination of a branch in the pattern,
        // and that path has a shorter minimum length than the current accumulated value,
        // replace the current accumulated value.
        if (forwardedLength.elementAti(loc) < currentLen) {
            currentLen = forwardedLength.elementAti(loc);
            U_ASSERT(currentLen>=0 && currentLen < INT32_MAX);
        }

        switch (opType) {
            // Ops that don't change the total length matched
        case URX_RESERVED_OP:
        case URX_END:
        case URX_FAIL:
        case URX_STRING_LEN:
        case URX_NOP:
        case URX_START_CAPTURE:
        case URX_END_CAPTURE:
        case URX_BACKSLASH_B:
        case URX_BACKSLASH_BU:
        case URX_BACKSLASH_G:
        case URX_BACKSLASH_Z:
        case URX_DOLLAR:
        case URX_DOLLAR_M:
        case URX_DOLLAR_D:
        case URX_DOLLAR_MD:
        case URX_RELOC_OPRND:
        case URX_STO_INP_LOC:
        case URX_BACKREF:         // BackRef.  Must assume that it might be a zero length match
        case URX_BACKREF_I:

        case URX_STO_SP:          // Setup for atomic or possessive blocks.  Doesn't change what can match.
        case URX_LD_SP:
            break;

        case URX_CARET:
            if (atStart) {
                fRXPat->fStartType = START_START;
            }
            break;

        case URX_CARET_M:
        case URX_CARET_M_UNIX:
            if (atStart) {
                fRXPat->fStartType = START_LINE;
            }
            break;

        case URX_ONECHAR:
            if (currentLen == 0) {
                // This character could appear at the start of a match.
                //   Add it to the set of possible starting characters.
                fRXPat->fInitialChars->add(URX_VAL(op));
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_SETREF:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn > 0 && sn < fRXPat->fSets->size());
                const UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(sn);
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;

        case URX_LOOP_SR_I:
            // [Set]*, like a SETREF, above, in what it can match,
            //  but may not match at all, so currentLen is not incremented.
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn > 0 && sn < fRXPat->fSets->size());
                const UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(sn);
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            atStart = FALSE;
            break;

        case URX_LOOP_DOT_I:
            if (currentLen == 0) {
                // .* at the start of a pattern.
                //    Any character can begin the match.
                fRXPat->fInitialChars->clear();
                fRXPat->fInitialChars->complement();
                numInitialStrings += 2;
            }
            atStart = FALSE;
            break;


        case URX_STATIC_SETREF:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                U_ASSERT(sn>0 && sn<URX_LAST_SET);
                const UnicodeSet *s = fRXPat->fStaticSets[sn];
                fRXPat->fInitialChars->addAll(*s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_STAT_SETREF_N:
            if (currentLen == 0) {
                int32_t  sn = URX_VAL(op);
                const UnicodeSet *s = fRXPat->fStaticSets[sn];
                UnicodeSet sc(*s);
                sc.complement();
                fRXPat->fInitialChars->addAll(sc);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_BACKSLASH_D:
            // Digit Char
             if (currentLen == 0) {
                 UnicodeSet s;
                 s.applyIntPropertyValue(UCHAR_GENERAL_CATEGORY_MASK, U_GC_ND_MASK, *fStatus);
                 if (URX_VAL(op) != 0) {
                     s.complement();
                 }
                 fRXPat->fInitialChars->addAll(s);
                 numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_H:
            // Horiz white space
            if (currentLen == 0) {
                UnicodeSet s;
                s.applyIntPropertyValue(UCHAR_GENERAL_CATEGORY_MASK, U_GC_ZS_MASK, *fStatus);
                s.add((UChar32)9);   // Tab
                if (URX_VAL(op) != 0) {
                    s.complement();
                }
                fRXPat->fInitialChars->addAll(s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_R:       // Any line ending sequence
        case URX_BACKSLASH_V:       // Any line ending code point, with optional negation
            if (currentLen == 0) {
                UnicodeSet s;
                s.add((UChar32)0x0a, (UChar32)0x0d);  // add range
                s.add((UChar32)0x85);
                s.add((UChar32)0x2028, (UChar32)0x2029);
                if (URX_VAL(op) != 0) {
                     // Complement option applies to URX_BACKSLASH_V only.
                     s.complement();
                }
                fRXPat->fInitialChars->addAll(s);
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;



        case URX_ONECHAR_I:
            // Case Insensitive Single Character.
            if (currentLen == 0) {
                UChar32  c = URX_VAL(op);
                if (u_hasBinaryProperty(c, UCHAR_CASE_SENSITIVE)) {
                    UnicodeSet starters(c, c);
                    starters.closeOver(USET_CASE_INSENSITIVE);
                    // findCaseInsensitiveStarters(c, &starters);
                    //   For ONECHAR_I, no need to worry about text chars that expand on folding into strings.
                    //   The expanded folding can't match the pattern.
                    fRXPat->fInitialChars->addAll(starters);
                } else {
                    // Char has no case variants.  Just add it as-is to the
                    //   set of possible starting chars.
                    fRXPat->fInitialChars->add(c);
                }
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_BACKSLASH_X:   // Grahpeme Cluster.  Minimum is 1, max unbounded.
        case URX_DOTANY_ALL:    // . matches one or two.
        case URX_DOTANY:
        case URX_DOTANY_UNIX:
            if (currentLen == 0) {
                // These constructs are all bad news when they appear at the start
                //   of a match.  Any character can begin the match.
                fRXPat->fInitialChars->clear();
                fRXPat->fInitialChars->complement();
                numInitialStrings += 2;
            }
            currentLen = safeIncrement(currentLen, 1);
            atStart = FALSE;
            break;


        case URX_JMPX:
            loc++;             // Except for extra operand on URX_JMPX, same as URX_JMP.
            U_FALLTHROUGH;
        case URX_JMP:
            {
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest < loc) {
                    // Loop of some kind.  Can safely ignore, the worst that will happen
                    //  is that we understate the true minimum length
                    currentLen = forwardedLength.elementAti(loc+1);

                } else {
                    // Forward jump.  Propagate the current min length to the target loc of the jump.
                    U_ASSERT(jmpDest <= end+1);
                    if (forwardedLength.elementAti(jmpDest) > currentLen) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                }
            }
            atStart = FALSE;
            break;

        case URX_JMP_SAV:
        case URX_JMP_SAV_X:
            // Combo of state save to the next loc, + jmp backwards.
            //   Net effect on min. length computation is nothing.
            atStart = FALSE;
            break;

        case URX_BACKTRACK:
            // Fails are kind of like a branch, except that the min length was
            //   propagated already, by the state save.
            currentLen = forwardedLength.elementAti(loc+1);
            atStart = FALSE;
            break;


        case URX_STATE_SAVE:
            {
                // State Save, for forward jumps, propagate the current minimum.
                //             of the state save.
                int32_t  jmpDest = URX_VAL(op);
                if (jmpDest > loc) {
                    if (currentLen < forwardedLength.elementAti(jmpDest)) {
                        forwardedLength.setElementAt(currentLen, jmpDest);
                    }
                }
            }
            atStart = FALSE;
            break;




        case URX_STRING:
            {
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                int32_t stringLen   = URX_VAL(stringLenOp);
                U_ASSERT(URX_TYPE(stringLenOp) == URX_STRING_LEN);
                U_ASSERT(stringLenOp >= 2);
                if (currentLen == 0) {
                    // Add the starting character of this string to the set of possible starting
                    //   characters for this pattern.
                    int32_t stringStartIdx = URX_VAL(op);
                    UChar32  c = fRXPat->fLiteralText.char32At(stringStartIdx);
                    fRXPat->fInitialChars->add(c);

                    // Remember this string.  After the entire pattern has been checked,
                    //  if nothing else is identified that can start a match, we'll use it.
                    numInitialStrings++;
                    fRXPat->fInitialStringIdx = stringStartIdx;
                    fRXPat->fInitialStringLen = stringLen;
                }

                currentLen = safeIncrement(currentLen, stringLen);
                atStart = FALSE;
            }
            break;

        case URX_STRING_I:
            {
                // Case-insensitive string.  Unlike exact-match strings, we won't
                //   attempt a string search for possible match positions.  But we
                //   do update the set of possible starting characters.
                loc++;
                int32_t stringLenOp = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                int32_t stringLen   = URX_VAL(stringLenOp);
                U_ASSERT(URX_TYPE(stringLenOp) == URX_STRING_LEN);
                U_ASSERT(stringLenOp >= 2);
                if (currentLen == 0) {
                    // Add the starting character of this string to the set of possible starting
                    //   characters for this pattern.
                    int32_t stringStartIdx = URX_VAL(op);
                    UChar32  c = fRXPat->fLiteralText.char32At(stringStartIdx);
                    UnicodeSet s;
                    findCaseInsensitiveStarters(c, &s);
                    fRXPat->fInitialChars->addAll(s);
                    numInitialStrings += 2;  // Matching on an initial string not possible.
                }
                currentLen = safeIncrement(currentLen, stringLen);
                atStart = FALSE;
            }
            break;

        case URX_CTR_INIT:
        case URX_CTR_INIT_NG:
            {
                // Loop Init Ops.  These don't change the min length, but they are 4 word ops
                //   so location must be updated accordingly.
                // Loop Init Ops.
                //   If the min loop count == 0
                //      move loc forwards to the end of the loop, skipping over the body.
                //   If the min count is > 0,
                //      continue normal processing of the body of the loop.
                int32_t loopEndLoc   = (int32_t)fRXPat->fCompiledPat->elementAti(loc+1);
                        loopEndLoc   = URX_VAL(loopEndLoc);
                int32_t minLoopCount = (int32_t)fRXPat->fCompiledPat->elementAti(loc+2);
                if (minLoopCount == 0) {
                    // Min Loop Count of 0, treat like a forward branch and
                    //   move the current minimum length up to the target
                    //   (end of loop) location.
                    U_ASSERT(loopEndLoc <= end+1);
                    if (forwardedLength.elementAti(loopEndLoc) > currentLen) {
                        forwardedLength.setElementAt(currentLen, loopEndLoc);
                    }
                }
                loc+=3;  // Skips over operands of CTR_INIT
            }
            atStart = FALSE;
            break;


        case URX_CTR_LOOP:
        case URX_CTR_LOOP_NG:
            // Loop ops.
            //  The jump is conditional, backwards only.
            atStart = FALSE;
            break;

        case URX_LOOP_C:
            // More loop ops.  These state-save to themselves.
            //   don't change the minimum match
            atStart = FALSE;
            break;


        case URX_LA_START:
        case URX_LB_START:
            {
                // Look-around.  Scan forward until the matching look-ahead end,
                //   without processing the look-around block.  This is overly pessimistic.

                // Keep track of the nesting depth of look-around blocks.  Boilerplate code for
                //   lookahead contains two LA_END instructions, so count goes up by two
                //   for each LA_START.
                int32_t  depth = (opType == URX_LA_START? 2: 1);
                for (;;) {
                    loc++;
                    op = (int32_t)fRXPat->fCompiledPat->elementAti(loc);
                    if (URX_TYPE(op) == URX_LA_START) {
                        depth+=2;
                    }
                    if (URX_TYPE(op) == URX_LB_START) {
                        depth++;
                    }
                    if (URX_TYPE(op) == URX_LA_END || URX_TYPE(op)==URX_LBN_END) {
                        depth--;
                        if (depth == 0) {
                            break;
                        }
                    }
                    if (URX_TYPE(op) == URX_STATE_SAVE) {
                        // Need this because neg lookahead blocks will FAIL to outside
                        //   of the block.
                        int32_t  jmpDest = URX_VAL(op);
                        if (jmpDest > loc) {
                            if (currentLen < forwardedLength.elementAti(jmpDest)) {
                                forwardedLength.setElementAt(currentLen, jmpDest);
                            }
                        }
                    }
                    U_ASSERT(loc <= end);
                }
            }
            break;

        case URX_LA_END:
        case URX_LB_CONT:
        case URX_LB_END:
        case URX_LBN_CONT:
        case URX_LBN_END:
            U_ASSERT(FALSE);     // Shouldn't get here.  These ops should be
                                 //  consumed by the scan in URX_LA_START and LB_START

            break;

        default:
            U_ASSERT(FALSE);
            }

        }


    // We have finished walking through the ops.  Check whether some forward jump
    //   propagated a shorter length to location end+1.
    if (forwardedLength.elementAti(end+1) < currentLen) {
        currentLen = forwardedLength.elementAti(end+1);
    }


    fRXPat->fInitialChars8->init(fRXPat->fInitialChars);


    // Sort out what we should check for when looking for candidate match start positions.
    // In order of preference,
    //     1.   Start of input text buffer.
    //     2.   A literal string.
    //     3.   Start of line in multi-line mode.
    //     4.   A single literal character.
    //     5.   A character from a set of characters.
    //
    if (fRXPat->fStartType == START_START) {
        // Match only at the start of an input text string.
        //    start type is already set.  We're done.
    } else if (numInitialStrings == 1 && fRXPat->fMinMatchLen > 0) {
        // Match beginning only with a literal string.
        UChar32  c = fRXPat->fLiteralText.char32At(fRXPat->fInitialStringIdx);
        U_ASSERT(fRXPat->fInitialChars->contains(c));
        fRXPat->fStartType   = START_STRING;
        fRXPat->fInitialChar = c;
    } else if (fRXPat->fStartType == START_LINE) {
        // Match at start of line in Multi-Line mode.
        // Nothing to do here; everything is already set.
    } else if (fRXPat->fMinMatchLen == 0) {
        // Zero length match possible.  We could start anywhere.
        fRXPat->fStartType = START_NO_INFO;
    } else if (fRXPat->fInitialChars->size() == 1) {
        // All matches begin with the same char.
        fRXPat->fStartType   = START_CHAR;
        fRXPat->fInitialChar = fRXPat->fInitialChars->charAt(0);
        U_ASSERT(fRXPat->fInitialChar != (UChar32)-1);
    } else if (fRXPat->fInitialChars->contains((UChar32)0, (UChar32)0x10ffff) == FALSE &&
        fRXPat->fMinMatchLen > 0) {
        // Matches start with a set of character smaller than the set of all chars.
        fRXPat->fStartType = START_SET;
    } else {
        // Matches can start with anything
        fRXPat->fStartType = START_NO_INFO;
    }

    return;
}